

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_info.cpp
# Opt level: O0

void __thiscall
duckdb::ArrowListInfo::ArrowListInfo
          (ArrowListInfo *this,shared_ptr<duckdb::ArrowType,_true> *child,ArrowVariableSizeType size
          )

{
  undefined1 in_DL;
  shared_ptr<duckdb::ArrowType,_true> *in_RSI;
  ArrowTypeInfo *in_RDI;
  
  ArrowTypeInfo::ArrowTypeInfo(in_RDI,LIST);
  in_RDI->_vptr_ArrowTypeInfo = (_func_int **)&PTR__ArrowListInfo_03534b78;
  in_RDI->field_0x9 = in_DL;
  in_RDI->field_0xa = 0;
  shared_ptr<duckdb::ArrowType,_true>::shared_ptr
            (in_RSI,(shared_ptr<duckdb::ArrowType,_true> *)in_RDI);
  return;
}

Assistant:

ArrowListInfo::ArrowListInfo(shared_ptr<ArrowType> child, ArrowVariableSizeType size)
    : ArrowTypeInfo(ArrowTypeInfoType::LIST), size_type(size), child(std::move(child)) {
}